

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticSynapse.cpp
# Opt level: O0

void __thiscall StaticSynapse::initialize(StaticSynapse *this,Population *n_from,Population *n_to)

{
  undefined4 uVar1;
  long *in_RDX;
  long *in_RSI;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_RDI;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_ffffffffffffffd0;
  Index in_stack_ffffffffffffffd8;
  
  uVar1 = (**(code **)(*in_RSI + 8))();
  *(undefined4 *)(in_RDI + 0x38) = uVar1;
  uVar1 = (**(code **)(*in_RDX + 8))();
  *(undefined4 *)(in_RDI + 0x3c) = uVar1;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            (in_stack_ffffffffffffffd8,(Index)in_stack_ffffffffffffffd0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=(in_stack_ffffffffffffffd0,in_RDI);
  *(long **)(in_RDI + 8) = in_RSI;
  *(long **)(in_RDI + 0x10) = in_RDX;
  return;
}

Assistant:

void StaticSynapse::initialize(Population* n_from, Population* n_to) {
    inputSize = n_from->getNumberOfNeurons();
    outputSize = n_to->getNumberOfNeurons();
    weights = Eigen::MatrixXd::Zero(inputSize, outputSize);
    from_population = n_from;
    to_population = n_to;
}